

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O1

void log<unsigned_char>(log_level level,char *format,uchar *args)

{
  char *__format;
  char *__format_00;
  
  if ((5 < (int)level) || (2 < (int)level && console_mode == '\x01')) {
    return;
  }
  switch(level) {
  case ERROR:
    if (log_id == 0xff) {
      log<unsigned_char>();
    }
    else {
      fprintf(_stderr,"\x1b[31m[ERROR][%d] ");
    }
    fprintf(_stderr,format,(ulong)*args);
    fputc(10,_stderr);
    return;
  case WARNING:
    __format_00 = "[WARNING]";
    __format = "\x1b[33m";
    break;
  case NOTICE:
    __format_00 = "[NOTICE]";
    __format = "\x1b[35m";
    break;
  case INFO:
    __format_00 = "[INFO]";
    __format = "\x1b[36m";
    break;
  case DEBUG:
    __format_00 = "[DEBUG]";
    __format = "\x1b[32m";
    break;
  case TRACE:
    __format_00 = "[TRACE]";
    __format = "\x1b[34m";
    break;
  default:
    goto switchD_00110b77_default;
  }
  printf(__format);
  printf(__format_00);
switchD_00110b77_default:
  if (log_id != 0xff) {
    printf("[%d] ");
  }
  printf(format,(ulong)*args);
  putchar(10);
  return;
}

Assistant:

void log(log_level level, const char *format, Args const & ... args){
    if(console_mode == 1 and level > log_level::NOTICE){
        return;
    }
    if(level > log_level::TRACE){
        return;
    }
    if(level == log_level::ERROR){
        if(log_id == 0xff){
            fprintf(stderr, "\e[31m[ERROR] ");

        }else{
            fprintf(stderr, "\e[31m[ERROR][%d] ", log_id);
        }
        fprintf(stderr, format, args...);
        fprintf(stderr, "\n");
        return;
    }
    switch(level){
        case log_level::WARNING:
            printf("\e[33m");
            printf("[WARNING]");
            break;
        case log_level::NOTICE:
            printf("\e[35m");
            printf("[NOTICE]");
            break;
        case log_level::INFO:
            printf("\e[36m");
            printf("[INFO]");
            break;
        case log_level::DEBUG:
            printf("\e[32m");
            printf("[DEBUG]");
            break;
        case log_level::TRACE:
            printf("\e[34m");
            printf("[TRACE]");

            break;
        case log_level::ERROR:
            break;
    }
    if(log_id != 0xff){
        printf("[%d] ", log_id);
    }
    printf(format, args ...);
    printf("\n");
}